

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::StepFile::StepFileImporter::InternReadFile
          (StepFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  shared_ptr<Assimp::IOStream> fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  shared_ptr<Assimp::IOStream> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  IOStream *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined **local_30 [2];
  
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(file->_M_dataplus)._M_p,mode_abi_cxx11_);
  local_40 = (IOStream *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_38,local_40);
  if (local_40 == (IOStream *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,"Failed to open file ",file);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_90._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
      local_90.field_2._M_allocated_capacity = *psVar3;
      local_90.field_2._8_8_ = plVar2[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar3;
    }
    local_90._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_90);
    *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_70.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  local_60._M_dataplus._M_p = (pointer)STEP::ReadFileHeader(&local_70);
  if (local_70.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  __n = *(size_t *)(local_60._M_dataplus._M_p + 0x48);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_60._M_dataplus._M_p + 0x40);
  if ((__n != 0) && (__n == DAT_00904818)) {
    iVar1 = bcmp((__rhs->_M_dataplus)._M_p,StepFileSchema_abi_cxx11_,__n);
    if (iVar1 == 0) goto LAB_0067df1e;
  }
  std::operator+(&local_90,"Unrecognized file schema: ",__rhs);
  std::runtime_error::runtime_error((runtime_error *)local_30,(string *)&local_90);
  local_30[0] = &PTR__runtime_error_0082bce0;
  std::runtime_error::~runtime_error((runtime_error *)local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0067df1e:
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr
            ((unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> *)&local_60);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return;
}

Assistant:

void StepFileImporter::InternReadFile(const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    std::shared_ptr<IOStream> fileStream(pIOHandler->Open(file, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + file + ".");
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(fileStream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();
    if (!head.fileSchema.size() || head.fileSchema != StepFileSchema) {
        DeadlyImportError("Unrecognized file schema: " + head.fileSchema);
    }
}